

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_0::BufferTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferTestInstance *this)

{
  SparseContext *pSVar1;
  TestStatus *pTVar2;
  BufferTestInstance *pBVar3;
  int iVar4;
  VkResult VVar5;
  InstanceInterface *pIVar6;
  VkPhysicalDevice pVVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ostream *poVar9;
  VkQueue pVVar10;
  long *plVar11;
  undefined8 *puVar12;
  long lVar13;
  NotSupportedError *this_00;
  uint uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  long *plVar16;
  char **value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  uint uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  bool bVar22;
  VkMemoryAllocateInfo memAlloc;
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  VkBuffer rawBuffer;
  deUint32 queueFamilyIndex;
  Move<vk::Handle<(vk::HandleType)7>_> memory;
  VkMemoryRequirements memReqs;
  VkBufferCreateInfo bufferParams;
  VkDeviceMemory rawMemory;
  VkDeviceSize testSizes [5];
  VkSparseBufferMemoryBindInfo sparseBufferMemoryBindInfo;
  ostringstream errorMsg;
  VkPhysicalDeviceMemoryProperties memoryProperties;
  undefined1 local_848 [24];
  VkAllocationCallbacks *pVStack_830;
  undefined4 local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_820;
  undefined1 local_818 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_808;
  string *local_7f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7e8;
  Handle<(vk::HandleType)8> local_7e0;
  long local_7d8;
  long local_7d0;
  long lStack_7c8;
  deUint32 local_7bc;
  VkBuffer local_7b8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_7b0;
  long *local_798;
  long local_790;
  long local_788;
  long lStack_780;
  VkDeviceMemory local_778;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_770;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_748;
  uint local_740;
  TestStatus *local_738;
  BufferTestInstance *local_730;
  undefined1 local_728 [48];
  deUint32 *local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  Handle<(vk::HandleType)7> local_6c0 [2];
  long local_6b0 [2];
  long local_6a0;
  ulong local_698 [5];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_670;
  undefined4 local_668;
  undefined1 *local_660;
  undefined1 local_658 [8];
  undefined1 auStack_650 [12];
  undefined1 auStack_644 [4];
  VkAllocationCallbacks *pVStack_640;
  ios_base local_5e8 [240];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4f8;
  VkPhysicalDeviceFeatures local_314;
  VkPhysicalDeviceMemoryProperties local_238;
  
  pIVar6 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar7 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceFeatures(&local_314,pIVar6,pVVar7);
  uVar18 = (this->m_testCase).flags;
  local_730 = this;
  if (((uVar18 & 1) == 0) || (local_314.sparseBinding != 0)) {
    if (((uVar18 & 2) == 0) || (local_314.sparseResidencyBuffer != 0)) {
      if (((uVar18 & 4) == 0) || (local_314.sparseResidencyAliased != 0)) {
        local_698[0] = 1;
        local_698[1] = 0x49d;
        local_698[2] = 0x3e77;
        local_698[3] = 0x4000;
        local_698[4] = 0xffffffffffffffff;
        local_7f0 = (string *)&__return_storage_ptr__->m_description;
        local_7e8 = &(__return_storage_ptr__->m_description).field_2;
        lVar13 = 0;
        local_738 = __return_storage_ptr__;
        do {
          pBVar3 = local_730;
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_698[lVar13];
          local_6a0 = lVar13;
          pVVar7 = Context::getPhysicalDevice((local_730->super_TestInstance).m_context);
          pIVar6 = Context::getInstanceInterface((pBVar3->super_TestInstance).m_context);
          pSVar1 = (pBVar3->m_sparseContext).
                   super_UniqueBase<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
                   .m_data.ptr;
          if (pSVar1 == (SparseContext *)0x0) {
            local_820 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)Context::getDevice((pBVar3->super_TestInstance).m_context);
          }
          else {
            local_820 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pSVar1->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
          }
          pSVar1 = (pBVar3->m_sparseContext).
                   super_UniqueBase<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
                   .m_data.ptr;
          if (pSVar1 == (SparseContext *)0x0) {
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)Context::getDeviceInterface((pBVar3->super_TestInstance).m_context);
          }
          else {
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&pSVar1->m_deviceInterface;
          }
          pSVar1 = (pBVar3->m_sparseContext).
                   super_UniqueBase<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
                   .m_data.ptr;
          if (pSVar1 == (SparseContext *)0x0) {
            local_7bc = Context::getUniversalQueueFamilyIndex
                                  ((pBVar3->super_TestInstance).m_context);
          }
          else {
            local_7bc = pSVar1->m_queueFamilyIndex;
          }
          ::vk::getPhysicalDeviceMemoryProperties(&local_238,pIVar6,pVVar7);
          ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_658,pIVar6,pVVar7);
          paVar15 = local_820;
          DStack_7b0.m_device = (VkDevice)0x0;
          DStack_7b0.m_allocator = (VkAllocationCallbacks *)0x0;
          local_7b8.m_internal = 0;
          DStack_7b0.m_deviceIface = (DeviceInterface *)0x0;
          DStack_770.m_device = (VkDevice)0x0;
          DStack_770.m_allocator = (VkAllocationCallbacks *)0x0;
          local_778.m_internal = 0;
          DStack_770.m_deviceIface = (DeviceInterface *)0x0;
          uVar18 = (pBVar3->m_testCase).flags;
          paVar17 = local_4f8;
          if (paVar21 <= local_4f8) {
            paVar17 = paVar21;
          }
          if ((uVar18 & 1) == 0) {
            paVar17 = paVar21;
          }
          local_728._0_4_ = 0xc;
          local_728._8_8_ = (void *)0x0;
          local_728._16_4_ = uVar18;
          local_728._24_8_ = &DAT_00000001;
          local_728._36_4_ = (pBVar3->m_testCase).sharingMode;
          local_728._32_4_ = (pBVar3->m_testCase).usage;
          local_728._40_4_ = 1;
          local_6f8 = &local_7bc;
          ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_848,
                             (DeviceInterface *)&paVar8->_M_allocated_capacity,
                             (VkDevice)local_820->_M_local_buf,(VkBufferCreateInfo *)local_728,
                             (VkAllocationCallbacks *)0x0);
          stack0xfffffffffffff9b8 =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_848._16_8_;
          pVStack_640 = pVStack_830;
          local_658 = (undefined1  [8])local_848._0_8_;
          auStack_650._0_8_ = local_848._8_8_;
          local_848._0_8_ = 0;
          local_848._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_848._16_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          pVStack_830 = (VkAllocationCallbacks *)0x0;
          if (local_7b8.m_internal != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                      (&DStack_7b0,local_7b8);
          }
          DStack_7b0.m_device = (VkDevice)stack0xfffffffffffff9b8;
          DStack_7b0.m_allocator = pVStack_640;
          local_7b8.m_internal = (deUint64)local_658;
          DStack_7b0.m_deviceIface = (DeviceInterface *)auStack_650._0_8_;
          if (local_848._0_8_ != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(local_848 + 8),
                       (VkBuffer)local_848._0_8_);
          }
          (**(code **)(paVar8->_M_allocated_capacity + 0x70))
                    (paVar8,paVar15,local_7b8.m_internal,&local_750);
          pTVar2 = local_738;
          if (local_740 == 0) {
            uVar18 = 0x20;
          }
          else {
            uVar18 = 0;
            if (local_740 != 0) {
              for (; (local_740 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
          }
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(-(long)local_748 &
                       (ulong)(local_748->_M_local_buf +
                              ((local_238.memoryHeaps[local_238.memoryTypes[uVar18].heapIndex].size
                               >> 1) - 1)));
          if (paVar17 <=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(-(long)local_748 &
                 (ulong)(local_748->_M_local_buf +
                        ((local_238.memoryHeaps[local_238.memoryTypes[uVar18].heapIndex].size >> 1)
                        - 1)))) {
            paVar21 = paVar17;
          }
          bVar22 = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778.m_internal ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            do {
              local_7e0.m_internal = 0;
              stack0xfffffffffffff9b8 =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              pVStack_640 = (VkAllocationCallbacks *)0x0;
              local_658 = (undefined1  [8])0x0;
              auStack_650._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_728._24_8_ = paVar21;
              if (local_7b8.m_internal != 0) {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                          (&DStack_7b0,local_7b8);
              }
              DStack_7b0.m_device = (VkDevice)0x0;
              DStack_7b0.m_allocator = (VkAllocationCallbacks *)0x0;
              local_7b8.m_internal = 0;
              DStack_7b0.m_deviceIface = (DeviceInterface *)0x0;
              if (local_658 != (undefined1  [8])0x0) {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                          ((Deleter<vk::Handle<(vk::HandleType)8>_> *)auStack_650,
                           (VkBuffer)local_658);
              }
              VVar5 = (**(code **)(paVar8->_M_allocated_capacity + 0x108))
                                (paVar8,local_820,local_728,0);
              if (VVar5 == VK_SUCCESS) {
                local_658 = (undefined1  [8])
                            ::vk::refdetails::check<vk::Handle<(vk::HandleType)8>>(local_7e0);
                stack0xfffffffffffff9b8 = local_820;
                pVStack_640 = (VkAllocationCallbacks *)0x0;
                auStack_650._0_8_ = paVar8;
                local_848._16_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                pVStack_830 = (VkAllocationCallbacks *)0x0;
                local_848._0_8_ = 0;
                local_848._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                if (local_7b8.m_internal != 0) {
                  ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                            (&DStack_7b0,local_7b8);
                }
                DStack_7b0.m_device = (VkDevice)stack0xfffffffffffff9b8;
                DStack_7b0.m_allocator = pVStack_640;
                local_7b8.m_internal = (deUint64)local_658;
                DStack_7b0.m_deviceIface = (DeviceInterface *)auStack_650._0_8_;
                if (local_848._0_8_ != 0) {
                  ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                            ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(local_848 + 8),
                             (VkBuffer)local_848._0_8_);
                }
                uVar14 = 0;
              }
              else {
                paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(-(long)local_748 &
                             (ulong)(local_748->_M_local_buf + (((ulong)paVar21 >> 4) - 1)));
                if ((paVar21 ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0) ||
                   (uVar14 = 2,
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_728._24_8_ == local_748)) {
                  local_798 = (long *)::vk::getResultName(VVar5);
                  de::toString<char_const*>((string *)local_818,(de *)&local_798,value);
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::replace((ulong)local_818,0,(char *)0x0,0xafdae2);
                  local_848._0_8_ = local_848 + 0x10;
                  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar12 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar12 == paVar15) {
                    local_848._16_8_ = paVar15->_M_allocated_capacity;
                    pVStack_830 = (VkAllocationCallbacks *)puVar12[3];
                  }
                  else {
                    local_848._16_8_ = paVar15->_M_allocated_capacity;
                    local_848._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*puVar12;
                  }
                  local_848._8_8_ = puVar12[1];
                  *puVar12 = paVar15;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  puVar12 = (undefined8 *)std::__cxx11::string::append(local_848);
                  local_658 = (undefined1  [8])(auStack_650 + 8);
                  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar12 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar12 == paVar15) {
                    unique0x10001307 =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)paVar15->_M_allocated_capacity;
                    pVStack_640 = (VkAllocationCallbacks *)puVar12[3];
                  }
                  else {
                    unique0x00012000 =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)paVar15->_M_allocated_capacity;
                    local_658 = (undefined1  [8])*puVar12;
                  }
                  auStack_650._0_8_ = puVar12[1];
                  *puVar12 = paVar15;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  pTVar2->m_code = QP_TEST_RESULT_FAIL;
                  (pTVar2->m_description)._M_dataplus._M_p = (pointer)local_7e8;
                  std::__cxx11::string::_M_construct<char*>
                            (local_7f0,local_658,(char *)(auStack_650._0_8_ + (long)local_658));
                  if (local_658 != (undefined1  [8])(auStack_650 + 8)) {
                    operator_delete((void *)local_658,
                                    (ulong)(stack0xfffffffffffff9b8->_M_local_buf + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_848._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_848 + 0x10)) {
                    operator_delete((void *)local_848._0_8_,(ulong)(local_848._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_818._0_8_ != &local_808) {
                    operator_delete((void *)local_818._0_8_,
                                    (ulong)(local_808._M_allocated_capacity + 1));
                  }
                  uVar14 = 1;
                }
              }
              if (uVar14 == 0) {
                (**(code **)(paVar8->_M_allocated_capacity + 0x70))
                          (paVar8,local_820,local_7b8.m_internal);
                if (local_750 < paVar21) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_658,"Requied memory size (",0x15);
                  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_658);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9," bytes) smaller than the buffer\'s size (",0x28);
                  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes)!",8);
                  std::__cxx11::stringbuf::str();
                  pTVar2->m_code = QP_TEST_RESULT_FAIL;
                  (pTVar2->m_description)._M_dataplus._M_p = (pointer)local_7e8;
                  std::__cxx11::string::_M_construct<char*>
                            (local_7f0,local_848._0_8_,(char *)(local_848._8_8_ + local_848._0_8_));
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_848._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_848 + 0x10)) {
                    operator_delete((void *)local_848._0_8_,(ulong)(local_848._16_8_ + 1));
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
                  std::ios_base::~ios_base(local_5e8);
                  bVar22 = false;
                  goto LAB_0043ce93;
                }
                local_6c0[0].m_internal = 0;
                local_848._0_4_ = 5;
                local_848._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_848._16_8_ = local_750;
                pVStack_830 = (VkAllocationCallbacks *)CONCAT44(pVStack_830._4_4_,uVar18);
                iVar4 = (**(code **)(paVar8->_M_allocated_capacity + 0x28))
                                  (paVar8,local_820,local_848,0);
                if (iVar4 == 0) {
                  local_658 = (undefined1  [8])
                              ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>(local_6c0[0]);
                  stack0xfffffffffffff9b8 = local_820;
                  pVStack_640 = (VkAllocationCallbacks *)0x0;
                  auStack_650._0_8_ = paVar8;
                  local_808._M_allocated_capacity = 0;
                  local_808._8_8_ = (VkAllocationCallbacks *)0x0;
                  local_818._0_8_ = (pointer)0x0;
                  local_818._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  if (local_778.m_internal != 0) {
                    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                              (&DStack_770,local_778);
                  }
                  DStack_770.m_device = (VkDevice)stack0xfffffffffffff9b8;
                  DStack_770.m_allocator = pVStack_640;
                  local_778.m_internal = (deUint64)local_658;
                  DStack_770.m_deviceIface = (DeviceInterface *)auStack_650._0_8_;
                  if ((pointer)local_818._0_8_ != (pointer)0x0) {
                    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                              ((Deleter<vk::Handle<(vk::HandleType)7>_> *)(local_818 + 8),
                               (VkDeviceMemory)local_818._0_8_);
                  }
                  uVar14 = 0;
                }
                else {
                  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(-(long)local_748 &
                               (ulong)(local_748->_M_local_buf + (((ulong)paVar21 >> 4) - 1)));
                  if ((paVar21 ==
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0) || (uVar14 = 2, local_750 == local_748)) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_658);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
                    std::ios_base::~ios_base(local_5e8);
                    plVar11 = (long *)std::__cxx11::string::replace
                                                ((ulong)&local_798,0,(char *)0x0,0xafdb44);
                    local_7e0.m_internal = (deUint64)&local_7d0;
                    plVar16 = plVar11 + 2;
                    if ((long *)*plVar11 == plVar16) {
                      local_7d0 = *plVar16;
                      lStack_7c8 = plVar11[3];
                    }
                    else {
                      local_7d0 = *plVar16;
                      local_7e0.m_internal = (deUint64)*plVar11;
                    }
                    local_7d8 = plVar11[1];
                    *plVar11 = (long)plVar16;
                    plVar11[1] = 0;
                    *(undefined1 *)(plVar11 + 2) = 0;
                    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_7e0);
                    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(puVar12 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar12 == paVar15) {
                      local_808._M_allocated_capacity = paVar15->_M_allocated_capacity;
                      local_808._8_8_ = puVar12[3];
                      local_818._0_8_ = &local_808;
                    }
                    else {
                      local_808._M_allocated_capacity = paVar15->_M_allocated_capacity;
                      local_818._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)*puVar12;
                    }
                    local_818._8_8_ = puVar12[1];
                    *puVar12 = paVar15;
                    puVar12[1] = 0;
                    *(undefined1 *)(puVar12 + 2) = 0;
                    pTVar2->m_code = QP_TEST_RESULT_FAIL;
                    (pTVar2->m_description)._M_dataplus._M_p = (pointer)local_7e8;
                    std::__cxx11::string::_M_construct<char*>
                              (local_7f0,local_818._0_8_,(char *)(local_818._8_8_ + local_818._0_8_)
                              );
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_818._0_8_ != &local_808) {
                      operator_delete((void *)local_818._0_8_,
                                      (ulong)(local_808._M_allocated_capacity + 1));
                    }
                    if ((long *)local_7e0.m_internal != &local_7d0) {
                      operator_delete((void *)local_7e0.m_internal,local_7d0 + 1);
                    }
                    if (local_798 != &local_788) {
                      operator_delete(local_798,local_788 + 1);
                    }
                    uVar14 = 1;
                  }
                }
                if ((uVar14 & 1) != 0) goto LAB_0043cda7;
              }
              else if (uVar14 != 2) goto LAB_0043cda7;
            } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_778.m_internal ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0);
            uVar14 = 0;
LAB_0043cda7:
            bVar22 = uVar14 == 0;
          }
LAB_0043ce93:
          paVar21 = local_820;
          if (bVar22) {
            if (((local_730->m_testCase).flags & 7) == 0) {
              iVar4 = (**(code **)(paVar8->_M_allocated_capacity + 0x60))
                                (paVar8,local_820,local_7b8.m_internal,local_778.m_internal);
              if (iVar4 == 0) goto LAB_0043d2a9;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
              std::ostream::_M_insert<unsigned_long>((ulong)local_658);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
              std::ios_base::~ios_base(local_5e8);
              puVar12 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)local_818,0,(char *)0x0,0xafdbe3);
              paVar21 = local_7e8;
              paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(puVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 == paVar8) {
                local_848._16_8_ = paVar8->_M_allocated_capacity;
                pVStack_830 = (VkAllocationCallbacks *)puVar12[3];
                local_848._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_848 + 0x10);
              }
              else {
                local_848._16_8_ = paVar8->_M_allocated_capacity;
                local_848._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar12;
              }
              local_848._8_8_ = puVar12[1];
              *puVar12 = paVar8;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append(local_848);
              local_728._0_8_ = local_728 + 0x10;
              plVar16 = plVar11 + 2;
              if ((long *)*plVar11 == plVar16) {
                local_728._16_8_ = *plVar16;
                local_728._24_8_ = plVar11[3];
              }
              else {
                local_728._16_8_ = *plVar16;
                local_728._0_8_ = (long *)*plVar11;
              }
              local_728._8_8_ = plVar11[1];
              *plVar11 = (long)plVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              pTVar2->m_code = QP_TEST_RESULT_FAIL;
              (pTVar2->m_description)._M_dataplus._M_p = (pointer)paVar21;
              std::__cxx11::string::_M_construct<char*>
                        (local_7f0,local_728._0_8_,(undefined1 *)(local_728._8_8_ + local_728._0_8_)
                        );
              if ((undefined1 *)local_728._0_8_ != local_728 + 0x10) {
                operator_delete((void *)local_728._0_8_,local_728._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_848._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_848 + 0x10)) {
                operator_delete((void *)local_848._0_8_,(ulong)(local_848._16_8_ + 1));
              }
              uVar19 = local_808._M_allocated_capacity;
              auVar20 = (undefined1  [8])local_818._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_818._0_8_ == &local_808) goto LAB_0043d416;
LAB_0043d40e:
              operator_delete((void *)auVar20,(ulong)(uVar19 + 1));
            }
            else {
              pVVar10 = ::vk::getDeviceQueue
                                  ((DeviceInterface *)&paVar8->_M_allocated_capacity,
                                   (VkDevice)local_820->_M_local_buf,local_7bc,0);
              local_848._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_848._8_8_ = local_750;
              local_848._16_8_ = local_778.m_internal;
              pVStack_830 = (VkAllocationCallbacks *)0x0;
              local_828 = 0;
              local_670 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_7b8.m_internal;
              local_668 = 1;
              local_728._8_8_ = (void *)0x0;
              local_6d8 = 0;
              uStack_6d0 = 0;
              local_6e8 = 0;
              uStack_6e0 = 0;
              local_6f8 = (deUint32 *)0x0;
              uStack_6f0 = 0;
              local_728._16_8_ = 0;
              local_728._24_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_728._0_8_ = (undefined1 *)0x7;
              local_728._32_4_ = 1;
              local_728._36_4_ = VK_SHARING_MODE_EXCLUSIVE;
              local_728._40_8_ = &local_670;
              local_660 = local_848;
              ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_658,
                                (DeviceInterface *)&paVar8->_M_allocated_capacity,
                                (VkDevice)paVar21->_M_local_buf,0,(VkAllocationCallbacks *)0x0);
              local_808._M_allocated_capacity = (size_type)stack0xfffffffffffff9b8;
              local_808._8_8_ = pVStack_640;
              local_818._0_8_ = local_658;
              local_818._8_8_ = auStack_650._0_8_;
              iVar4 = (**(code **)(paVar8->_M_allocated_capacity + 0x88))
                                (paVar8,pVVar10,1,local_728,local_658);
              if (iVar4 == 0) {
                VVar5 = (**(code **)(paVar8->_M_allocated_capacity + 0xb0))
                                  (paVar8,local_820,1,local_818,1,0xffffffffffffffff);
                ::vk::checkResult(VVar5,
                                  "vk.waitForFences(vkDevice, 1, &fence.get(), VK_TRUE, ~(0ull) )",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
                                  ,0x15d);
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
                std::ostream::_M_insert<unsigned_long>((ulong)local_658);
                paVar21 = local_7e8;
                std::__cxx11::stringbuf::str();
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
                std::ios_base::~ios_base(local_5e8);
                plVar11 = (long *)std::__cxx11::string::replace
                                            ((ulong)local_6c0,0,(char *)0x0,0xafdb69);
                local_798 = &local_788;
                plVar16 = plVar11 + 2;
                if ((long *)*plVar11 == plVar16) {
                  local_788 = *plVar16;
                  lStack_780 = plVar11[3];
                }
                else {
                  local_788 = *plVar16;
                  local_798 = (long *)*plVar11;
                }
                local_790 = plVar11[1];
                *plVar11 = (long)plVar16;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_798);
                local_7e0.m_internal = (deUint64)&local_7d0;
                plVar16 = plVar11 + 2;
                if ((long *)*plVar11 == plVar16) {
                  local_7d0 = *plVar16;
                  lStack_7c8 = plVar11[3];
                }
                else {
                  local_7d0 = *plVar16;
                  local_7e0.m_internal = (deUint64)*plVar11;
                }
                local_7d8 = plVar11[1];
                *plVar11 = (long)plVar16;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                pTVar2->m_code = QP_TEST_RESULT_FAIL;
                (pTVar2->m_description)._M_dataplus._M_p = (pointer)paVar21;
                std::__cxx11::string::_M_construct<char*>
                          (local_7f0,local_7e0.m_internal,local_7d8 + local_7e0.m_internal);
                if ((long *)local_7e0.m_internal != &local_7d0) {
                  operator_delete((void *)local_7e0.m_internal,local_7d0 + 1);
                }
                if (local_798 != &local_788) {
                  operator_delete(local_798,local_788 + 1);
                }
                if ((long *)local_6c0[0].m_internal != local_6b0) {
                  operator_delete((void *)local_6c0[0].m_internal,local_6b0[0] + 1);
                }
              }
              if ((pointer)local_818._0_8_ != (pointer)0x0) {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                          ((Deleter<vk::Handle<(vk::HandleType)6>_> *)(local_818 + 8),
                           (VkFence)local_818._0_8_);
              }
              if (iVar4 == 0) {
LAB_0043d2a9:
                paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(auStack_650 + 8);
                auStack_650._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x4;
                stack0xfffffffffffff9b8 =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)CONCAT35(auStack_644._1_3_,0x73736150);
                pTVar2->m_code = QP_TEST_RESULT_PASS;
                (pTVar2->m_description)._M_dataplus._M_p = (pointer)local_7e8;
                local_658 = (undefined1  [8])paVar21;
                std::__cxx11::string::_M_construct<char*>(local_7f0,paVar21,auStack_644);
                uVar19 = stack0xfffffffffffff9b8;
                auVar20 = local_658;
                if (local_658 != (undefined1  [8])paVar21) goto LAB_0043d40e;
              }
            }
          }
LAB_0043d416:
          if (local_778.m_internal != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                      (&DStack_770,local_778);
          }
          if (local_7b8.m_internal != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                      (&DStack_7b0,local_7b8);
          }
          paVar21 = local_7e8;
          if (pTVar2->m_code != QP_TEST_RESULT_PASS) {
            return pTVar2;
          }
          plVar11 = (long *)(pTVar2->m_description)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar11 != local_7e8) {
            operator_delete(plVar11,local_7e8->_M_allocated_capacity + 1);
          }
          lVar13 = local_6a0 + 1;
          if (lVar13 == 5) {
            local_658 = (undefined1  [8])(auStack_650 + 8);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"Pass","");
            pTVar2->m_code = QP_TEST_RESULT_PASS;
            (pTVar2->m_description)._M_dataplus._M_p = (pointer)paVar21;
            std::__cxx11::string::_M_construct<char*>
                      (local_7f0,local_658,(char *)(auStack_650._0_8_ + (long)local_658));
            if (local_658 != (undefined1  [8])(auStack_650 + 8)) {
              operator_delete((void *)local_658,(ulong)(stack0xfffffffffffff9b8->_M_local_buf + 1));
            }
            return pTVar2;
          }
        } while( true );
      }
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Sparse aliased residency feature is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
                 ,0x173);
    }
    else {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Sparse buffer residency feature is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
                 ,0x170);
    }
  }
  else {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Sparse bindings feature is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
               ,0x16d);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus BufferTestInstance::iterate (void)
{
	const VkPhysicalDeviceFeatures&	physicalDeviceFeatures	= getPhysicalDeviceFeatures(getInstanceInterface(), getPhysicalDevice());

	if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_BINDING_BIT ) && !physicalDeviceFeatures.sparseBinding)
		TCU_THROW(NotSupportedError, "Sparse bindings feature is not supported");

	if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT ) && !physicalDeviceFeatures.sparseResidencyBuffer)
		TCU_THROW(NotSupportedError, "Sparse buffer residency feature is not supported");

	if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_ALIASED_BIT ) && !physicalDeviceFeatures.sparseResidencyAliased)
		TCU_THROW(NotSupportedError, "Sparse aliased residency feature is not supported");

	const VkDeviceSize testSizes[] =
	{
		1,
		1181,
		15991,
		16384,
		~0ull,		// try to exercise a very large buffer too (will be clamped to a sensible size later)
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(testSizes); ++i)
	{
		const tcu::TestStatus testStatus = bufferCreateAndAllocTest(testSizes[i]);

		if (testStatus.getCode() != QP_TEST_RESULT_PASS)
			return testStatus;
	}

	return tcu::TestStatus::pass("Pass");
}